

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  u64 n;
  byte bVar2;
  sqlite3_vfs *psVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  void *pvVar7;
  _func_void *p_Var8;
  char *pcVar9;
  void **__s;
  char *zBuf;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uchar uVar13;
  uchar uVar14;
  byte *pbVar15;
  uint uVar16;
  uint uVar17;
  void *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_38 = (void *)0x0;
  if (zFile == (char *)0x0) {
    uVar16 = 0;
  }
  else {
    sVar5 = strlen(zFile);
    uVar16 = (uint)sVar5 & 0x3fffffff;
  }
  if (pzErrMsg == (char **)0x0) {
    uVar11 = 1;
    if ((db->flags & 0x10000) == 0) goto LAB_00127219;
LAB_00126ec2:
    uVar17 = uVar16 + 300;
    pcVar6 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      pcVar6 = zProc;
    }
    pvVar7 = (*psVar3->xDlOpen)(psVar3,zFile);
    if (pvVar7 == (void *)0x0) {
      pcVar9 = sqlite3_mprintf("%s.%s",zFile,"so");
      if (pcVar9 != (char *)0x0) {
        pvVar7 = (*psVar3->xDlOpen)(psVar3,pcVar9);
        sqlite3_free(pcVar9);
        if (pvVar7 == (void *)0x0) {
          uVar11 = 1;
          if (pzErrMsg != (char **)0x0) {
            iVar4 = sqlite3_initialize();
            if (iVar4 == 0) {
              pcVar6 = (char *)sqlite3Malloc((ulong)uVar17);
              *pzErrMsg = pcVar6;
              if (pcVar6 != (char *)0x0) {
                sqlite3_snprintf(uVar17,pcVar6,"unable to open shared library [%s]",zFile);
                (*psVar3->xDlError)(psVar3,uVar16 + 299,pcVar6);
              }
            }
            else {
              *pzErrMsg = (char *)0x0;
            }
          }
          goto LAB_00127219;
        }
        goto LAB_00126ef4;
      }
LAB_00127123:
      uVar11 = 7;
      goto LAB_00127219;
    }
LAB_00126ef4:
    p_Var8 = (*psVar3->xDlSym)(psVar3,pvVar7,pcVar6);
    uVar16 = 0;
    if (zProc == (char *)0x0 && p_Var8 == (_func_void *)0x0) {
      if (zFile != (char *)0x0) {
        sVar5 = strlen(zFile);
        uVar16 = (uint)sVar5 & 0x3fffffff;
      }
      iVar4 = sqlite3_initialize();
      if ((iVar4 != 0) ||
         (pcVar6 = (char *)sqlite3Malloc((ulong)(uVar16 + 0x1e)), pcVar6 == (char *)0x0)) {
        (*psVar3->xDlClose)(psVar3,pvVar7);
        goto LAB_00127123;
      }
      builtin_strncpy(pcVar6,"sqlite3_",8);
      uVar10 = (ulong)uVar16;
      do {
        if ((long)uVar10 < 1) {
          uVar11 = 0;
          uVar16 = uVar11;
          if (zFile == (char *)0x0) goto LAB_0012726e;
          goto LAB_00127166;
        }
        uVar1 = uVar10 - 1;
        lVar12 = uVar10 - 1;
        uVar10 = uVar1;
      } while (zFile[lVar12] != '/');
      uVar11 = (int)uVar1 + 1;
LAB_00127166:
      lVar12 = 0;
      do {
        if ((ulong)(byte)zFile[lVar12 + (ulong)uVar11] == 0) {
          uVar14 = ""[(byte)"itilib"[lVar12 + 3]];
          uVar13 = '\0';
LAB_0012725c:
          uVar16 = uVar11 + 3;
          if (uVar13 != uVar14) {
            uVar16 = uVar11;
          }
          goto LAB_0012726e;
        }
        uVar13 = ""[(byte)zFile[lVar12 + (ulong)uVar11]];
        uVar14 = ""[(byte)"itilib"[lVar12 + 3]];
        if (uVar13 != uVar14) goto LAB_0012725c;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      uVar16 = uVar11 + 3;
LAB_0012726e:
      iVar4 = 8;
      for (pbVar15 = (byte *)(zFile + (int)uVar16);
          (bVar2 = *pbVar15, bVar2 != 0 && (bVar2 != 0x2e)); pbVar15 = pbVar15 + 1) {
        if ((""[bVar2] & 2) != 0) {
          lVar12 = (long)iVar4;
          iVar4 = iVar4 + 1;
          pcVar6[lVar12] = ""[(uint)(int)(char)bVar2];
        }
      }
      (pcVar6 + (long)iVar4 + 4)[0] = 't';
      (pcVar6 + (long)iVar4 + 4)[1] = '\0';
      builtin_strncpy(pcVar6 + iVar4,"_ini",4);
      p_Var8 = (*psVar3->xDlSym)(psVar3,pvVar7,pcVar6);
      pcVar9 = pcVar6;
    }
    else {
      pcVar9 = (char *)0x0;
    }
    if (p_Var8 == (_func_void *)0x0) {
      if (pzErrMsg != (char **)0x0) {
        sVar5 = strlen(pcVar6);
        iVar4 = sqlite3_initialize();
        if (iVar4 == 0) {
          uVar17 = ((uint)sVar5 & 0x3fffffff) + uVar17;
          zBuf = (char *)sqlite3Malloc((ulong)uVar17);
          *pzErrMsg = zBuf;
          if (zBuf != (char *)0x0) {
            sqlite3_snprintf(uVar17,zBuf,"no entry point [%s] in shared library [%s]",pcVar6,zFile);
            (*psVar3->xDlError)(psVar3,uVar17 - 1,zBuf);
          }
        }
        else {
          *pzErrMsg = (char *)0x0;
        }
      }
      (*psVar3->xDlClose)(psVar3,pvVar7);
      sqlite3_free(pcVar9);
    }
    else {
      sqlite3_free(pcVar9);
      iVar4 = (*p_Var8)(db,&local_38,&sqlite3Apis);
      if (iVar4 == 0) {
        n = (long)db->nExtension * 8 + 8;
        __s = (void **)sqlite3DbMallocRawNN(db,n);
        if (__s != (void **)0x0) {
          memset(__s,0,n);
          if (0 < (long)db->nExtension) {
            memcpy(__s,db->aExtension,(long)db->nExtension << 3);
          }
          if (db->aExtension != (void **)0x0) {
            sqlite3DbFreeNN(db,db->aExtension);
          }
          db->aExtension = __s;
          iVar4 = db->nExtension;
          db->nExtension = iVar4 + 1;
          __s[iVar4] = pvVar7;
          uVar11 = 0;
          goto LAB_00127219;
        }
        goto LAB_00127123;
      }
      uVar11 = 0;
      if (iVar4 == 0x100) goto LAB_00127219;
      if (pzErrMsg != (char **)0x0) {
        pcVar6 = sqlite3_mprintf("error during initialization: %s",local_38);
        *pzErrMsg = pcVar6;
      }
      sqlite3_free(local_38);
      (*psVar3->xDlClose)(psVar3,pvVar7);
    }
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x10000) != 0) goto LAB_00126ec2;
    pcVar6 = sqlite3_mprintf("not authorized");
    *pzErrMsg = pcVar6;
  }
  uVar11 = 1;
LAB_00127219:
  if (db->mallocFailed == '\0') {
    uVar11 = uVar11 & db->errMask;
  }
  else {
    apiOomError(db);
    uVar11 = 7;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar11;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}